

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

bool __thiscall Vehicle::owner(Vehicle *this,unique_ptr<Person,_std::default_delete<Person>_> *o)

{
  std::__uniq_ptr_impl<Person,_std::default_delete<Person>_>::operator=
            ((__uniq_ptr_impl<Person,_std::default_delete<Person>_> *)&this->_owner,
             (__uniq_ptr_impl<Person,_std::default_delete<Person>_> *)o);
  return (this->_owner)._M_t.super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
         super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
         super__Head_base<0UL,_Person_*,_false>._M_head_impl != (Person *)0x0;
}

Assistant:

bool owner(std::unique_ptr<Person> o) { _owner = std::move(o); return !!_owner; }